

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.h
# Opt level: O1

void install_symbol(void *context,fb_symbol_t *sym)

{
  undefined1 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  fb_symbol_t *pfVar4;
  size_t sVar5;
  undefined1 *puVar6;
  undefined1 *__dest;
  
  if (sym->kind < 5) {
    pfVar4 = (fb_symbol_t *)
             ptr_set_find_item((ptr_set_t *)(*(long *)((long)context + 0x58) + 0x128),sym[1].ident);
    if (pfVar4 != (fb_symbol_t *)0x0) {
      pfVar4 = sym;
    }
  }
  else {
    pfVar4 = (fb_symbol_t *)0x0;
  }
  if (pfVar4 != (fb_symbol_t *)0x0) {
    puVar1 = *(undefined1 **)((long)context + 0x50);
    __dest = puVar1;
    if (*context != 0) {
      for (pfVar4 = (pfVar4[1].link)->link; pfVar4 != (fb_symbol_t *)0x0; pfVar4 = pfVar4->link) {
        sVar5 = (size_t)(int)pfVar4->ident->len;
        memcpy(__dest,pfVar4->ident->text,sVar5);
        puVar6 = __dest + sVar5;
        __dest = puVar6 + 1;
        *puVar6 = 0x2e;
      }
    }
    sVar5 = (size_t)(int)sym->ident->len;
    memcpy(__dest,sym->ident->text,sVar5);
    __dest[sVar5] = 0;
    *(undefined1 **)((long)context + 0x50) = __dest + sVar5 + 1;
    if ((ulong)sym->kind < 5) {
      lVar2 = *(long *)(&DAT_00141958 + (ulong)sym->kind * 8);
      puVar3 = *(undefined8 **)((long)context + lVar2);
      *puVar3 = sym;
      puVar3[1] = puVar1;
      *(undefined8 **)((long)context + lVar2) = puVar3 + 2;
    }
  }
  return;
}

Assistant:

static void install_symbol(void *context, fb_symbol_t *sym)
{
    catalog_t *catalog = context;
    fb_ref_t *scope_name;
    int n = 0;
    char *s, *name;
    fb_compound_type_t *ct;
    
    if (!(ct = get_compound_if_visible(catalog->schema, sym))) {
        return;
    }

    s = catalog->next_name;
    name = s;
    if (catalog->qualify_names) {
        scope_name = ct->scope->name;
        while (scope_name) {
            n = (int)scope_name->ident->len;
            memcpy(s, scope_name->ident->text, (size_t)n);
            s += n;
            *s++ = '.';
            scope_name = scope_name->link;
        }
    }
    n = (int)sym->ident->len;
    memcpy(s, sym->ident->text, (size_t)n);
    s += n;
    *s++ = '\0';
    catalog->next_name = s;

    switch (sym->kind) {
    case fb_is_struct:
    case fb_is_table:
        catalog->next_object->ct = (fb_compound_type_t *)sym;
        catalog->next_object->name = name;
        catalog->next_object++;
        break;
    case fb_is_union:
    case fb_is_enum:
        catalog->next_enum->ct = (fb_compound_type_t *)sym;
        catalog->next_enum->name = name;
        catalog->next_enum++;
        break;
    case fb_is_rpc_service:
        catalog->next_service->ct = (fb_compound_type_t *)sym;
        catalog->next_service->name = name;
        catalog->next_service++;
        break;
    default: break;
    }
}